

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O2

char * lookup_name(name_cache_conflict *cache,_func_char_ptr_name_cache_ptr_id_t *lookup_fn,id_t id)

{
  char *pcVar1;
  int iVar2;
  anon_struct_16_2_515341a9 *paVar3;
  
  cache->probes = cache->probes + 1;
  iVar2 = (int)((ulong)id % cache->size);
  paVar3 = cache->cache + iVar2;
  pcVar1 = cache->cache[iVar2].name;
  if (pcVar1 != (char *)0x0) {
    if (paVar3->id == id) {
      cache->hits = cache->hits + 1;
      if (pcVar1 == "(noname)") {
        return (char *)0x0;
      }
      return pcVar1;
    }
    if (pcVar1 != "(noname)") {
      free(pcVar1);
    }
    cache->cache[iVar2].name = (char *)0x0;
  }
  pcVar1 = (*lookup_fn)(cache,id);
  if (pcVar1 == (char *)0x0) {
    cache->cache[iVar2].name = "(noname)";
    paVar3->id = id;
    pcVar1 = (char *)0x0;
  }
  else {
    cache->cache[iVar2].name = pcVar1;
    paVar3->id = id;
  }
  return pcVar1;
}

Assistant:

static const char *
lookup_name(struct cpio *cpio, struct name_cache **name_cache_variable,
    int (*lookup_fn)(struct cpio *, const char **, id_t), id_t id)
{
	char asnum[16];
	struct name_cache	*cache;
	const char *name;
	int slot;


	if (*name_cache_variable == NULL) {
		*name_cache_variable = malloc(sizeof(struct name_cache));
		if (*name_cache_variable == NULL)
			lafe_errc(1, ENOMEM, "No more memory");
		memset(*name_cache_variable, 0, sizeof(struct name_cache));
		(*name_cache_variable)->size = name_cache_size;
	}

	cache = *name_cache_variable;
	cache->probes++;

	slot = id % cache->size;
	if (cache->cache[slot].name != NULL) {
		if (cache->cache[slot].id == id) {
			cache->hits++;
			return (cache->cache[slot].name);
		}
		free(cache->cache[slot].name);
		cache->cache[slot].name = NULL;
	}

	if (lookup_fn(cpio, &name, id) == 0) {
		if (name == NULL || name[0] == '\0') {
			/* If lookup failed, format it as a number. */
			snprintf(asnum, sizeof(asnum), "%u", (unsigned)id);
			name = asnum;
		}
		cache->cache[slot].name = strdup(name);
		if (cache->cache[slot].name != NULL) {
			cache->cache[slot].id = id;
			return (cache->cache[slot].name);
		}
		/*
		 * Conveniently, NULL marks an empty slot, so
		 * if the strdup() fails, we've just failed to
		 * cache it.  No recovery necessary.
		 */
	}
	return (NULL);
}